

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hungarian_algorithm.h
# Opt level: O2

void __thiscall
hungarian_algorithm::
HungarianSolver<boost::chrono::duration<long,boost::ratio<1l,1l>>,unsigned_long,std::less<boost::chrono::duration<long,boost::ratio<1l,1l>>>>
::
solve<boost::numeric::ublas::matrix<boost::chrono::duration<long,boost::ratio<1l,1l>>,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,boost::ratio<1l,1l>>,std::allocator<boost::chrono::duration<long,boost::ratio<1l,1l>>>>>>
          (HungarianSolver<boost::chrono::duration<long,boost::ratio<1l,1l>>,unsigned_long,std::less<boost::chrono::duration<long,boost::ratio<1l,1l>>>>
           *this,matrix<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>_>
                 *cost_function)

{
  char cVar1;
  
  if ((*(long *)this != 0) && (*(long *)(this + 8) != 0)) {
    copyAndNormalizeCosts<boost::numeric::ublas::matrix<boost::chrono::duration<long,boost::ratio<1l,1l>>,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,boost::ratio<1l,1l>>,std::allocator<boost::chrono::duration<long,boost::ratio<1l,1l>>>>>>
              (this,cost_function);
    while (cVar1 = hungarian_algorithm::HungarianSolverBase::areAllColumnsCovered(), cVar1 == '\0')
    {
      while (cVar1 = hungarian_algorithm::HungarianSolverBase::findAssignment(), cVar1 == '\0') {
        HungarianSolver<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_unsigned_long,_std::less<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>
        ::subtractSmallestUncoveredElement
                  ((HungarianSolver<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_unsigned_long,_std::less<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>
                    *)this);
      }
    }
  }
  return;
}

Assistant:

void solve(const CostFunction& cost_function)
  {
    if (num_rows_ != 0 && num_cols_ != 0)
    {
      copyAndNormalizeCosts<CostFunction>(cost_function);
      while (!areAllColumnsCovered())
      {
        while (!findAssignment())
        {
          // No zeros found => generate more zeros by subtracting smallest remaining element:
          subtractSmallestUncoveredElement();
        }
      }
    }
  }